

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

uint GetAccessSize(VmInstruction *inst)

{
  VmValue **ppVVar1;
  VmConstant *pVVar2;
  VmConstant *loadInst;
  VmConstant *size;
  VmInstruction *inst_local;
  
  switch(inst->cmd) {
  case VM_INST_LOAD_BYTE:
    inst_local._4_4_ = 1;
    break;
  case VM_INST_LOAD_SHORT:
    inst_local._4_4_ = 2;
    break;
  case VM_INST_LOAD_INT:
    inst_local._4_4_ = 4;
    break;
  case VM_INST_LOAD_FLOAT:
    inst_local._4_4_ = 4;
    break;
  case VM_INST_LOAD_DOUBLE:
    inst_local._4_4_ = 8;
    break;
  case VM_INST_LOAD_LONG:
    inst_local._4_4_ = 8;
    break;
  case VM_INST_LOAD_STRUCT:
    inst_local._4_4_ = (inst->super_VmValue).type.size;
    break;
  default:
    __assert_fail("!\"unknown access instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                  ,0x119,"unsigned int GetAccessSize(VmInstruction *)");
  case VM_INST_STORE_BYTE:
    inst_local._4_4_ = 1;
    break;
  case VM_INST_STORE_SHORT:
    inst_local._4_4_ = 2;
    break;
  case VM_INST_STORE_INT:
    inst_local._4_4_ = 4;
    break;
  case VM_INST_STORE_FLOAT:
    inst_local._4_4_ = 4;
    break;
  case VM_INST_STORE_DOUBLE:
    inst_local._4_4_ = 8;
    break;
  case VM_INST_STORE_LONG:
    inst_local._4_4_ = 8;
    break;
  case VM_INST_STORE_STRUCT:
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,2);
    inst_local._4_4_ = ((*ppVVar1)->type).size;
    break;
  case VM_INST_MEM_COPY:
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,4);
    pVVar2 = getType<VmConstant>(*ppVVar1);
    if (pVVar2 == (VmConstant *)0x0) {
      __assert_fail("!\"invalid memcopy instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                    ,0xf3,"unsigned int GetAccessSize(VmInstruction *)");
    }
    inst_local._4_4_ = pVVar2->iValue;
    break;
  case VM_INST_ADD_LOAD:
  case VM_INST_SUB_LOAD:
  case VM_INST_MUL_LOAD:
  case VM_INST_DIV_LOAD:
  case VM_INST_POW_LOAD:
  case VM_INST_MOD_LOAD:
  case VM_INST_LESS_LOAD:
  case VM_INST_GREATER_LOAD:
  case VM_INST_LESS_EQUAL_LOAD:
  case VM_INST_GREATER_EQUAL_LOAD:
  case VM_INST_EQUAL_LOAD:
  case VM_INST_NOT_EQUAL_LOAD:
  case VM_INST_SHL_LOAD:
  case VM_INST_SHR_LOAD:
  case VM_INST_BIT_AND_LOAD:
  case VM_INST_BIT_OR_LOAD:
  case VM_INST_BIT_XOR_LOAD:
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,3);
    pVVar2 = getType<VmConstant>(*ppVVar1);
    if (pVVar2 == (VmConstant *)0x0) {
LAB_0022aa53:
      __assert_fail("!\"unknown load type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                    ,0x113,"unsigned int GetAccessSize(VmInstruction *)");
    }
    if (pVVar2->iValue - 2U < 2) {
      inst_local._4_4_ = 4;
    }
    else {
      if (1 < pVVar2->iValue - 4U) goto LAB_0022aa53;
      inst_local._4_4_ = 8;
    }
  }
  return inst_local._4_4_;
}

Assistant:

unsigned GetAccessSize(VmInstruction *inst)
{
	switch(inst->cmd)
	{
	case VM_INST_LOAD_BYTE:
		return 1;
	case VM_INST_LOAD_SHORT:
		return 2;
	case VM_INST_LOAD_INT:
		return 4;
	case VM_INST_LOAD_FLOAT:
		return 4;
	case VM_INST_LOAD_DOUBLE:
		return 8;
	case VM_INST_LOAD_LONG:
		return 8;
	case VM_INST_LOAD_STRUCT:
		return inst->type.size;
	case VM_INST_STORE_BYTE:
		return 1;
	case VM_INST_STORE_SHORT:
		return 2;
	case VM_INST_STORE_INT:
		return 4;
	case VM_INST_STORE_FLOAT:
		return 4;
	case VM_INST_STORE_DOUBLE:
		return 8;
	case VM_INST_STORE_LONG:
		return 8;
	case VM_INST_STORE_STRUCT:
		return inst->arguments[2]->type.size;
	case VM_INST_MEM_COPY:
		if(VmConstant *size = getType<VmConstant>(inst->arguments[4]))
			return size->iValue;

		assert(!"invalid memcopy instruction");
		break;
	case VM_INST_ADD_LOAD:
	case VM_INST_SUB_LOAD:
	case VM_INST_MUL_LOAD:
	case VM_INST_DIV_LOAD:
	case VM_INST_POW_LOAD:
	case VM_INST_MOD_LOAD:
	case VM_INST_LESS_LOAD:
	case VM_INST_GREATER_LOAD:
	case VM_INST_LESS_EQUAL_LOAD:
	case VM_INST_GREATER_EQUAL_LOAD:
	case VM_INST_EQUAL_LOAD:
	case VM_INST_NOT_EQUAL_LOAD:
	case VM_INST_SHL_LOAD:
	case VM_INST_SHR_LOAD:
	case VM_INST_BIT_AND_LOAD:
	case VM_INST_BIT_OR_LOAD:
	case VM_INST_BIT_XOR_LOAD:
		if(VmConstant *loadInst = getType<VmConstant>(inst->arguments[3]))
		{
			switch(loadInst->iValue)
			{
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
				return 4;
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
				return 8;
			}
		}

		assert(!"unknown load type");
		break;
	default:
		break;
	}

	assert(!"unknown access instruction");
	return 0;
}